

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-linux.c
# Opt level: O1

FUNCTION_RETURN getDiskInfos(DiskInfo *diskInfos,size_t *disk_info_size)

{
  char *pcVar1;
  ushort *puVar2;
  uint uVar3;
  int iVar4;
  DiskInfo *pDVar5;
  undefined8 *puVar6;
  DIR *pDVar7;
  dirent *pdVar8;
  size_t __size;
  DiskInfo *__s;
  size_t __n;
  ushort **ppuVar9;
  void *pvVar10;
  int *piVar11;
  __ino_t _Var12;
  ulong *puVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  FUNCTION_RETURN FVar17;
  ulong uVar18;
  uint uVar19;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar20;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar21;
  uchar cur_character;
  stat sym_stat;
  stat mount_stat;
  char cur_dir [4096];
  byte local_11ad;
  uint local_11ac;
  DiskInfo *local_11a8;
  void *local_11a0;
  ulong *local_1198;
  DiskInfo *local_1190;
  DIR *local_1188;
  __ino_t local_1180;
  dirent *local_1178;
  char *local_1170;
  long local_1168;
  ulong *local_1160;
  stat local_1158;
  stat local_10c8;
  char local_1038 [4104];
  
  if (diskInfos == (DiskInfo *)0x0) {
    pDVar5 = (DiskInfo *)malloc(0x28f0);
    lVar15 = 0x14;
  }
  else {
    lVar15 = (long)(int)*disk_info_size;
    pDVar5 = diskInfos;
  }
  memset(pDVar5,0,lVar15 * 0x20c);
  local_11a0 = malloc(lVar15 << 3);
  memset(local_11a0,0,lVar15 << 3);
  lVar15 = setmntent("/proc/mounts","r");
  if (lVar15 == 0) {
    free(pDVar5);
LAB_001fceca:
    FVar17 = FUNC_RET_ERROR;
  }
  else {
    local_11a8 = pDVar5;
    local_1198 = disk_info_size;
    local_1190 = diskInfos;
    puVar6 = (undefined8 *)getmntent(lVar15);
    uVar14 = 0;
    if (puVar6 != (undefined8 *)0x0) {
      uVar14 = 0;
      do {
        pcVar1 = (char *)puVar6[2];
        iVar4 = strncmp(pcVar1,"ext",3);
        if (((((iVar4 == 0) || (iVar4 = strncmp(pcVar1,"xfs",3), iVar4 == 0)) ||
             (iVar4 = strncmp(pcVar1,"vfat",4), iVar4 == 0)) ||
            (iVar4 = strncmp(pcVar1,"ntfs",4), iVar4 == 0)) &&
           (((pcVar1 = (char *)*puVar6, pcVar1 != (char *)0x0 &&
             (iVar4 = strncmp(pcVar1,"/dev/",5), iVar4 == 0)) &&
            (iVar4 = stat(pcVar1,&local_10c8), iVar4 == 0)))) {
          if ((int)uVar14 < 1) {
            uVar19 = 0xffffffff;
          }
          else {
            uVar16 = 0xffffffff;
            uVar18 = 0;
            do {
              if (*(__ino_t *)((long)local_11a0 + uVar18 * 8) == local_10c8.st_ino) {
                uVar16 = uVar18 & 0xffffffff;
              }
              uVar19 = (uint)uVar16;
              uVar18 = uVar18 + 1;
            } while (uVar14 != uVar18);
          }
          uVar3 = uVar14;
          if (uVar19 == 0xffffffff) {
            strncpy(local_11a8[(int)uVar14].device,(char *)*puVar6,0xfe);
            *(__ino_t *)((long)local_11a0 + (long)(int)uVar14 * 8) = local_10c8.st_ino;
            uVar3 = uVar14 + 1;
            uVar19 = uVar14;
          }
          uVar14 = uVar3;
          iVar4 = strcmp((char *)puVar6[1],"/");
          if (iVar4 == 0) {
            local_11a8[(int)uVar19].label[4] = '\0';
            builtin_strncpy(local_11a8[(int)uVar19].label,"root",4);
            local_11a8[(int)uVar19].preferred = true;
          }
        }
        puVar6 = (undefined8 *)getmntent(lVar15);
      } while (puVar6 != (undefined8 *)0x0);
    }
    local_11ac = uVar14;
    endmntent(lVar15);
    puVar13 = local_1198;
    if (local_1190 == (DiskInfo *)0x0) {
      *local_1198 = (long)(int)local_11ac;
      free(local_11a8);
    }
    else {
      uVar16 = (ulong)(int)local_11ac;
      FVar17 = FUNC_RET_BUFFER_TOO_SMALL;
      if (*local_1198 < uVar16) goto LAB_001fceea;
      pDVar7 = opendir("/dev/disk/by-uuid");
      if (pDVar7 == (DIR *)0x0) {
        piVar11 = __errno_location();
        uVar20 = extraout_XMM0_Da;
        uVar21 = extraout_XMM0_Db;
        if (*piVar11 != 0) {
          strerror(*piVar11);
          uVar20 = extraout_XMM0_Da_00;
          uVar21 = extraout_XMM0_Db_00;
        }
        _log((double)CONCAT44(uVar21,uVar20));
        goto LAB_001fceca;
      }
      *puVar13 = uVar16;
      pdVar8 = readdir(pDVar7);
      local_1198 = (ulong *)(ulong)local_11ac;
      if (pdVar8 != (dirent *)0x0) {
        local_1188 = pDVar7;
        do {
          builtin_strncpy(local_1038,"/dev/disk/by-uuid/",0x13);
          local_1170 = pdVar8->d_name;
          strncat(local_1038,local_1170,200);
          iVar4 = stat(local_1038,&local_1158);
          if ((iVar4 == 0) && (0 < (int)local_11ac)) {
            puVar13 = (ulong *)0x0;
            local_1180 = local_1158.st_ino;
            pvVar10 = local_11a0;
            _Var12 = local_1158.st_ino;
            local_1178 = pdVar8;
            do {
              pcVar1 = local_1170;
              if (_Var12 == *(__ino_t *)((long)pvVar10 + (long)puVar13 * 8)) {
                local_1160 = puVar13;
                __size = strlen(local_1170);
                __s = (DiskInfo *)malloc(__size);
                pDVar5 = local_11a8 + (long)puVar13;
                pDVar5->disk_sn[0] = '\0';
                pDVar5->disk_sn[1] = '\0';
                pDVar5->disk_sn[2] = '\0';
                pDVar5->disk_sn[3] = '\0';
                pDVar5->disk_sn[4] = '\0';
                pDVar5->disk_sn[5] = '\0';
                pDVar5->disk_sn[6] = '\0';
                pDVar5->disk_sn[7] = '\0';
                local_1168 = (long)puVar13 * 0x20c;
                __n = strlen(pcVar1);
                uVar16 = 0;
                memset(__s,0,__n);
                if (__size != 0) {
                  ppuVar9 = __ctype_b_loc();
                  puVar2 = *ppuVar9;
                  uVar16 = 0;
                  lVar15 = 0x13;
                  do {
                    if ((*(byte *)((long)puVar2 + (long)pdVar8->d_name[lVar15 + -0x13] * 2 + 1) &
                        0x10) != 0) {
                      __s->device[uVar16 - 4] = pdVar8->d_name[lVar15 + -0x13];
                      uVar16 = (ulong)((int)uVar16 + 1);
                    }
                    iVar4 = (int)lVar15;
                    lVar15 = lVar15 + 1;
                  } while (iVar4 - 0x12 < __size);
                }
                lVar15 = local_1168;
                pDVar5 = local_11a8;
                uVar18 = uVar16;
                if ((uVar16 & 1) != 0) {
                  uVar18 = (ulong)((int)uVar16 + 1);
                  __s->device[uVar16 - 4] = '0';
                }
                __s->device[uVar18 - 4] = '\0';
                local_1190 = __s;
                if (1 < (uint)uVar18) {
                  uVar16 = 0;
                  do {
                    __isoc99_sscanf(__s,"%2hhx",&local_11ad);
                    pDVar5->disk_sn[(ulong)((uint)uVar16 & 7) + lVar15] =
                         pDVar5->disk_sn[(ulong)((uint)uVar16 & 7) + lVar15] ^ local_11ad;
                    uVar16 = uVar16 + 1;
                    __s = (DiskInfo *)((long)&__s->id + 2);
                  } while ((uint)uVar18 >> 1 != uVar16);
                }
                free(local_1190);
                pvVar10 = local_11a0;
                _Var12 = local_1180;
                puVar13 = local_1160;
                pdVar8 = local_1178;
              }
              puVar13 = (ulong *)((long)puVar13 + 1);
            } while (puVar13 != local_1198);
          }
          pDVar7 = local_1188;
          pdVar8 = readdir(local_1188);
        } while (pdVar8 != (dirent *)0x0);
      }
      closedir(pDVar7);
      pDVar7 = opendir("/dev/disk/by-label");
      FVar17 = FUNC_RET_OK;
      if (pDVar7 == (DIR *)0x0) goto LAB_001fceea;
      pdVar8 = readdir(pDVar7);
      if (pdVar8 != (dirent *)0x0) {
        local_11a8 = (DiskInfo *)local_11a8->label;
        do {
          builtin_strncpy(local_1038,"/dev/disk/by-label/",0x14);
          strcat(local_1038,pdVar8->d_name);
          iVar4 = stat(local_1038,&local_1158);
          if ((iVar4 == 0) && (0 < (int)local_11ac)) {
            puVar13 = (ulong *)0x0;
            pvVar10 = local_11a0;
            pDVar5 = local_11a8;
            do {
              if (local_1158.st_ino == *(__ino_t *)((long)pvVar10 + (long)puVar13 * 8)) {
                strncpy((char *)pDVar5,pdVar8->d_name,0xfe);
                printf("label %d %s %s\n",(ulong)puVar13 & 0xffffffff,pDVar5,pDVar5[-1].disk_sn + 2)
                ;
                pvVar10 = local_11a0;
              }
              puVar13 = (ulong *)((long)puVar13 + 1);
              pDVar5 = pDVar5 + 1;
            } while (local_1198 != puVar13);
          }
          pdVar8 = readdir(pDVar7);
        } while (pdVar8 != (dirent *)0x0);
      }
      closedir(pDVar7);
    }
    FVar17 = FUNC_RET_OK;
  }
LAB_001fceea:
  free(local_11a0);
  return FVar17;
}

Assistant:

FUNCTION_RETURN getDiskInfos(DiskInfo * diskInfos, size_t * disk_info_size) {
	struct stat mount_stat, sym_stat;
	/*static char discard[1024];
	 char device[64], name[64], type[64];
	 */
	char cur_dir[MAX_PATH];
	struct mntent *ent;

	int maxDrives, currentDrive, i, drive_found;
	__ino64_t *statDrives = NULL;
	DiskInfo *tmpDrives = NULL;
	FILE *aFile = NULL;
	DIR *disk_by_uuid_dir = NULL, *disk_by_label = NULL;
	struct dirent *dir = NULL;
	FUNCTION_RETURN result;

	if (diskInfos != NULL) {
		maxDrives = *disk_info_size;
		tmpDrives = diskInfos;
	} else {
		maxDrives = MAX_UNITS;
		tmpDrives = (DiskInfo *) malloc(sizeof(DiskInfo) * maxDrives);
	}
	memset(tmpDrives, 0, sizeof(DiskInfo) * maxDrives);
	statDrives = (__ino64_t *) malloc(maxDrives * sizeof(__ino64_t ));
	memset(statDrives, 0, sizeof(__ino64_t ) * maxDrives);
	;

	aFile = setmntent("/proc/mounts", "r");
	if (aFile == NULL) {
		/*proc not mounted*/
		free(tmpDrives);
		free(statDrives);
		return FUNC_RET_ERROR;
	}

	currentDrive = 0;
	while (NULL != (ent = getmntent(aFile))) {
		if ((strncmp(ent->mnt_type, "ext", 3) == 0
				|| strncmp(ent->mnt_type, "xfs", 3) == 0
				|| strncmp(ent->mnt_type, "vfat", 4) == 0
				|| strncmp(ent->mnt_type, "ntfs", 4) == 0)
				&& ent->mnt_fsname != NULL
				&& strncmp(ent->mnt_fsname, "/dev/", 5) == 0) {
			if (stat(ent->mnt_fsname, &mount_stat) == 0) {
				drive_found = -1;
				for (i = 0; i < currentDrive; i++) {
					if (statDrives[i] == mount_stat.st_ino) {
						drive_found = i;
					}
				}
				if (drive_found == -1) {
					LOG_DEBUG("mntent: %s %s %d\n", ent->mnt_fsname, ent->mnt_dir,
							(unsigned long int)mount_stat.st_ino);
					strncpy(tmpDrives[currentDrive].device, ent->mnt_fsname, 255-1);
					statDrives[currentDrive] = mount_stat.st_ino;
					drive_found = currentDrive;
					currentDrive++;
				}
				if (strcmp(ent->mnt_dir, "/") == 0) {
					strcpy(tmpDrives[drive_found].label, "root");
					LOG_DEBUG("drive %s set to preferred\n", ent->mnt_fsname);
					tmpDrives[drive_found].preferred = true;
				}
			}
		}
	}
	endmntent(aFile);

	if (diskInfos == NULL) {
		*disk_info_size = currentDrive;
		free(tmpDrives);
		result = FUNC_RET_OK;
	} else if (*disk_info_size >= currentDrive) {
		disk_by_uuid_dir = opendir("/dev/disk/by-uuid");
		if (disk_by_uuid_dir == NULL) {
			LOG_WARN("Open /dev/disk/by-uuid fail");
			free(statDrives);
			return FUNC_RET_ERROR;
		}
		result = FUNC_RET_OK;
		*disk_info_size = currentDrive;
		while ((dir = readdir(disk_by_uuid_dir)) != NULL) {
			strcpy(cur_dir, "/dev/disk/by-uuid/");
			strncat(cur_dir, dir->d_name, 200);
			if (stat(cur_dir, &sym_stat) == 0) {
				for (i = 0; i < currentDrive; i++) {
					if (sym_stat.st_ino == statDrives[i]) {
						parseUUID(dir->d_name, tmpDrives[i].disk_sn,
								sizeof(tmpDrives[i].disk_sn));
#ifdef _DEBUG
						VALGRIND_CHECK_VALUE_IS_DEFINED(tmpDrives[i].device);

						LOG_DEBUG("uuid %d %s %02x%02x%02x%02x\n", i,
								tmpDrives[i].device,
								tmpDrives[i].disk_sn[0],
								tmpDrives[i].disk_sn[1],
								tmpDrives[i].disk_sn[2],
								tmpDrives[i].disk_sn[3]);
#endif
					}
				}
			}
		}
		closedir(disk_by_uuid_dir);

		disk_by_label = opendir("/dev/disk/by-label");
		if (disk_by_label != NULL) {
			while ((dir = readdir(disk_by_label)) != NULL) {
				strcpy(cur_dir, "/dev/disk/by-label/");
				strcat(cur_dir, dir->d_name);
				if (stat(cur_dir, &sym_stat) == 0) {
					for (i = 0; i < currentDrive; i++) {
						if (sym_stat.st_ino == statDrives[i]) {
							strncpy(tmpDrives[i].label, dir->d_name, 255-1);
							printf("label %d %s %s\n", i, tmpDrives[i].label,
									tmpDrives[i].device);
						}
					}
				}
			}
			closedir(disk_by_label);
		}
	} else {
		result = FUNC_RET_BUFFER_TOO_SMALL;
	}
	/*
	 FILE *mounts = fopen(_PATH_MOUNTED, "r");
	 if (mounts == NULL) {
	 return ERROR;
	 }

	 while (fscanf(mounts, "%64s %64s %64s %1024[^\n]", device, name, type,
	 discard) != EOF) {
	 if (stat(device, &mount_stat) != 0)
	 continue;
	 if (filename_stat.st_dev == mount_stat.st_rdev) {
	 fprintf(stderr, "device: %s; name: %s; type: %s\n", device, name,
	 type);
	 }
	 }
	 */
	free(statDrives);
	return result;
}